

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O3

int __thiscall Car::get_ypos(Car *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    iVar1 = this->_ypos;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int Car::get_ypos(){
         std::lock_guard lck(mtx);
         return _ypos;
    }